

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

DescriptorFlags __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
GetRootSetter(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>
              *this,DynamicObject *instance,PropertyId propertyId,Var *setterValue,
             PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  DescriptorFlags DVar3;
  undefined4 *puVar4;
  
  if ((((instance->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) !=
      TypeIds_GlobalObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x5c5,"(VarIs<RootObjectBase>(instance))",
                                "Instance must be a root object!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  DVar3 = GetSetter_Internal<true>(this,instance,propertyId,setterValue,info,requestContext);
  return DVar3;
}

Assistant:

DescriptorFlags SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetRootSetter(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(VarIs<RootObjectBase>(instance), "Instance must be a root object!");
        return GetSetter_Internal<true>(instance, propertyId, setterValue, info, requestContext);
    }